

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkRedirectCiCo(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Nm_Man_t *p;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pNode;
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  char *__s2;
  uint uVar5;
  long lVar6;
  
  pVVar3 = pNtk->vCos;
  if (pVVar3->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar6];
      p = pNtk->pManName;
      pcVar4 = Nm_ManCreateUniqueName(pObj->pNtk->pManName,pObj->Id);
      uVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar4,2,5);
      if (uVar1 != 0xffffffff) {
        if (((int)uVar1 < 0) || (pNtk->vObjs->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pFaninNew = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar1];
        pcVar4 = Nm_ManCreateUniqueName(pObj->pNtk->pManName,pObj->Id);
        __s2 = Nm_ManCreateUniqueName(pFaninNew->pNtk->pManName,pFaninNew->Id);
        iVar2 = strcmp(pcVar4,__s2);
        if (iVar2 != 0) {
          __assert_fail("!strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                        ,0x278,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
        }
        pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
        if (pNode != pFaninNew) {
          iVar2 = Abc_NodeIsBuf(pNode);
          if (iVar2 == 0) {
            __assert_fail("Abc_NodeIsBuf(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                          ,0x27c,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
          }
          Abc_ObjPatchFanin(pObj,pNode,pFaninNew);
          if ((pNode->vFanouts).nSize == 0) {
            Abc_NtkDeleteObj(pNode);
          }
          uVar5 = uVar5 + 1;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar6 < pVVar3->nSize);
  }
  if (uVar5 == 0) {
    return;
  }
  printf("Redirected %d POs from buffers to PIs with the same name.\n",(ulong)uVar5);
  return;
}

Assistant:

void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pObjCi, * pFanin; 
    int i, Count = 0;
    // if CO points to CI with the same name, remove buffer between them
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        int nCiId = Nm_ManFindIdByNameTwoTypes( pNtk->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( nCiId == -1 )
            continue;
        pObjCi = Abc_NtkObj( pNtk, nCiId );
        assert( !strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) ) );
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin == pObjCi )
            continue;
        assert( Abc_NodeIsBuf(pFanin) );
        Abc_ObjPatchFanin( pObj, pFanin, pObjCi );
        if ( Abc_ObjFanoutNum(pFanin) == 0 )
            Abc_NtkDeleteObj( pFanin );
        Count++;
    }
    if ( Count )
        printf( "Redirected %d POs from buffers to PIs with the same name.\n", Count );
}